

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refcount.h
# Opt level: O0

Own<kj::(anonymous_namespace)::InMemoryDirectory> __thiscall
kj::AtomicRefcounted::addRefInternal<kj::(anonymous_namespace)::InMemoryDirectory>
          (AtomicRefcounted *this,InMemoryDirectory *object)

{
  InMemoryDirectory *extraout_RDX;
  Own<kj::(anonymous_namespace)::InMemoryDirectory> OVar1;
  AtomicRefcounted *local_30;
  AtomicRefcounted *refcounted;
  InMemoryDirectory *object_local;
  
  local_30 = (AtomicRefcounted *)0x0;
  if (object != (InMemoryDirectory *)0x0) {
    local_30 = &object->super_AtomicRefcounted;
  }
  LOCK();
  local_30->refcount = local_30->refcount + 1;
  UNLOCK();
  Own<kj::(anonymous_namespace)::InMemoryDirectory>::Own
            ((Own<kj::(anonymous_namespace)::InMemoryDirectory> *)this,object,
             &local_30->super_Disposer);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = &this->super_Disposer;
  return OVar1;
}

Assistant:

kj::Own<T> AtomicRefcounted::addRefInternal(T* object) {
  AtomicRefcounted* refcounted = object;
#if _MSC_VER
  KJ_MSVC_INTERLOCKED(Increment, nf)(&refcounted->refcount);
#else
  __atomic_add_fetch(&refcounted->refcount, 1, __ATOMIC_RELAXED);
#endif
  return kj::Own<T>(object, *refcounted);
}